

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySampling.cpp
# Opt level: O0

void glcts::prepareGradXForFace
               (GLfloat *grad_x,GLuint face,GLfloat *texture_coordinates,GLuint width)

{
  GLuint grad_offset_2;
  GLuint texture_coordinates_offset_2;
  GLuint i_2;
  GLuint grad_offset_1;
  GLuint texture_coordinates_offset_1;
  GLuint i_1;
  GLuint grad_offset;
  GLuint texture_coordinates_offset;
  GLuint i;
  GLuint width_local;
  GLfloat *texture_coordinates_local;
  GLuint face_local;
  GLfloat *grad_x_local;
  
  for (grad_offset = 0; grad_offset < 9; grad_offset = grad_offset + 2) {
    getRightNeighbour(texture_coordinates + (grad_offset << 2),face,1,width,
                      grad_x + (grad_offset << 2));
  }
  for (grad_offset_1 = 1; grad_offset_1 < 9; grad_offset_1 = grad_offset_1 + 2) {
    getRightNeighbour(texture_coordinates + (grad_offset_1 << 2),face,width << 2,width,
                      grad_x + (grad_offset_1 << 2));
  }
  for (grad_offset_2 = 0; grad_offset_2 < 9; grad_offset_2 = grad_offset_2 + 1) {
    vectorSubtractInPlace<3u>
              (grad_x + (grad_offset_2 << 2),texture_coordinates + (grad_offset_2 << 2));
  }
  return;
}

Assistant:

void prepareGradXForFace(glw::GLfloat* grad_x, glw::GLuint face, glw::GLfloat* texture_coordinates, glw::GLuint width)
{
	static const glw::GLuint n_points_per_face				  = 9;
	static const glw::GLuint n_texture_coordinates_components = 4;
	static const glw::GLuint n_grad_components				  = 4;

	for (glw::GLuint i = 0; i < n_points_per_face; i += 2)
	{
		const glw::GLuint texture_coordinates_offset = i * n_texture_coordinates_components;
		const glw::GLuint grad_offset				 = i * n_grad_components;

		getRightNeighbour(texture_coordinates + texture_coordinates_offset, face, 1, width, grad_x + grad_offset);
	}

	for (glw::GLuint i = 1; i < n_points_per_face; i += 2)
	{
		const glw::GLuint texture_coordinates_offset = i * n_texture_coordinates_components;
		const glw::GLuint grad_offset				 = i * n_grad_components;

		getRightNeighbour(texture_coordinates + texture_coordinates_offset, face, 4 * width, width,
						  grad_x + grad_offset);
	}

	for (glw::GLuint i = 0; i < n_points_per_face; ++i)
	{
		const glw::GLuint texture_coordinates_offset = i * n_texture_coordinates_components;
		const glw::GLuint grad_offset				 = i * n_grad_components;

		vectorSubtractInPlace<3>(grad_x + grad_offset, texture_coordinates + texture_coordinates_offset);
	}
}